

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp.cc
# Opt level: O0

bool __thiscall fizplex::LP::is_feasible(LP *this,DVector *x)

{
  ulong uVar1;
  bool bVar2;
  size_t *psVar3;
  size_type sVar4;
  size_t sVar5;
  ColMatrix *pCVar6;
  double *pdVar7;
  long in_RDI;
  size_t col;
  double val;
  size_t row;
  size_t i;
  bool feasible;
  Debug *in_stack_ffffffffffffff28;
  DVector *in_stack_ffffffffffffff30;
  double in_stack_ffffffffffffff38;
  DVector *in_stack_ffffffffffffff40;
  ColMatrix *this_00;
  Debug local_68;
  ColMatrix *local_58;
  DVector *local_50;
  ulong local_48;
  Debug local_40;
  Debug local_30;
  ulong local_20;
  byte local_11;
  
  psVar3 = DVector::dimension(in_stack_ffffffffffffff30);
  sVar5 = *psVar3;
  sVar4 = std::vector<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>::size
                    ((vector<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_> *)
                     (in_RDI + 0x58));
  if (sVar5 != sVar4) {
    __assert_fail("x.dimension() == cols.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp.cc"
                  ,0x98,"bool fizplex::LP::is_feasible(const DVector &) const");
  }
  local_11 = 1;
  for (local_20 = 0; uVar1 = local_20,
      sVar4 = std::vector<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>::size
                        ((vector<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_> *)
                         (in_RDI + 0x58)), uVar1 < sVar4; local_20 = local_20 + 1) {
    std::vector<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>::operator[]
              ((vector<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_> *)(in_RDI + 0x58),
               local_20);
    bVar2 = is_finite(9.8424447724666e-318);
    if (bVar2) {
      DVector::operator[](in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
      std::vector<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>::operator[]
                ((vector<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_> *)
                 (in_RDI + 0x58),local_20);
      bVar2 = is_lower_norm((double)in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
      if (bVar2) {
        Debug::Debug(&local_30,0,(ostream *)&std::cerr);
        Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
        Debug::operator<<((Debug *)in_stack_ffffffffffffff30,
                          (unsigned_long)in_stack_ffffffffffffff28);
        Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
        DVector::operator[](in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
        Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
        Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
        std::vector<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>::operator[]
                  ((vector<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_> *)
                   (in_RDI + 0x58),local_20);
        Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
        Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
        local_11 = 0;
      }
    }
    std::vector<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>::operator[]
              ((vector<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_> *)(in_RDI + 0x58),
               local_20);
    bVar2 = is_finite(9.84398625728162e-318);
    if (bVar2) {
      DVector::operator[](in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
      std::vector<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>::operator[]
                ((vector<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_> *)
                 (in_RDI + 0x58),local_20);
      bVar2 = is_greater_norm((double)in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
      if (bVar2) {
        Debug::Debug(&local_40,0,(ostream *)&std::cerr);
        Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
        Debug::operator<<((Debug *)in_stack_ffffffffffffff30,
                          (unsigned_long)in_stack_ffffffffffffff28);
        Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
        DVector::operator[](in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
        Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
        Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
        std::vector<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>::operator[]
                  ((vector<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_> *)
                   (in_RDI + 0x58),local_20);
        Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
        Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
        local_11 = 0;
      }
    }
  }
  for (local_48 = 0; uVar1 = local_48, sVar5 = row_count((LP *)0x1e6853), uVar1 < sVar5;
      local_48 = local_48 + 1) {
    local_50 = (DVector *)0x0;
    local_58 = (ColMatrix *)0x0;
    while (this_00 = local_58, pCVar6 = (ColMatrix *)column_count((LP *)0x1e6893), this_00 < pCVar6)
    {
      in_stack_ffffffffffffff38 =
           ColMatrix::get_value
                     (this_00,(size_t)in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30);
      pdVar7 = DVector::operator[]((DVector *)this_00,(size_t)in_stack_ffffffffffffff38);
      local_50 = (DVector *)(in_stack_ffffffffffffff38 * *pdVar7 + (double)local_50);
      local_58 = (ColMatrix *)
                 ((long)&(local_58->cols).
                         super__Vector_base<fizplex::SVector,_std::allocator<fizplex::SVector>_>.
                         _M_impl.super__Vector_impl_data._M_start + 1);
    }
    in_stack_ffffffffffffff30 = local_50;
    pdVar7 = DVector::operator[]((DVector *)this_00,(size_t)in_stack_ffffffffffffff38);
    bVar2 = is_eq_norm((double)in_stack_ffffffffffffff30,*pdVar7,0.0001,1e-05);
    if (!bVar2) {
      Debug::Debug(&local_68,0,(ostream *)&std::cerr);
      Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
      Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(unsigned_long)in_stack_ffffffffffffff28)
      ;
      Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff28 =
           Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
      DVector::operator[]((DVector *)this_00,(size_t)in_stack_ffffffffffffff38);
      Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
      Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
      Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(double)in_stack_ffffffffffffff28);
      Debug::operator<<((Debug *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
      local_11 = 0;
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool LP::is_feasible(const DVector &x) const {
  assert(x.dimension() == cols.size());
  bool feasible = true;
  for (size_t i = 0; i < cols.size(); i++) {
    if (is_finite(cols[i].lower) && is_lower_norm(x[i], cols[i].lower)) {
      Debug(0) << "Var " << i << " is below lower bound: " << x[i] << " < "
               << cols[i].lower << "\n";
      feasible = false;
    }
    if (is_finite(cols[i].upper) && is_greater_norm(x[i], cols[i].upper)) {
      Debug(0) << "Var " << i << " is above upper bound: " << x[i] << " > "
               << cols[i].upper << "\n";
      feasible = false;
    }
  }
  for (size_t row = 0; row < row_count(); row++) {
    double val = 0.0;
    for (size_t col = 0; col < column_count(); col++)
      val += A.get_value(row, col) * x[col];
    if (!is_eq_norm(val, b[row], 1e-4, 1e-5)) {
      Debug(0) << "Row " << row << " failed equality test ("
               << "should be: " << b[row] << ", is " << val << ")\n";
      feasible = false;
    }
  }
  return feasible;
}